

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool Catch::list(IEventListener *reporter,Config *config)

{
  key_type *pkVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar6;
  undefined4 extraout_var_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *pvVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pTVar8;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *__function;
  key_type *__k;
  char cVar11;
  long *plVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_bool> pVar13;
  StringRef SVar14;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> descriptions;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases;
  map<Catch::StringRef,_Catch::TagInfo,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  tagCounts;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  _Rb_tree_node_base local_f8;
  Config *local_d8;
  IEventListener *local_d0;
  undefined1 local_c8 [8];
  _Rb_tree_node_base _Stack_c0;
  size_t local_a0;
  undefined8 uStack_98;
  pointer local_88;
  pointer local_80;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_78;
  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  local_60;
  
  cVar11 = (config->m_data).listTests;
  if ((bool)cVar11 == true) {
    iVar4 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar6);
    pvVar7 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x20))
                       ((long *)CONCAT44(extraout_var_00,iVar5),config);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)local_128,
                pvVar7,(TestSpec *)CONCAT44(extraout_var,iVar4),&config->super_IConfig);
    (*reporter->_vptr_IEventListener[0x16])(reporter,local_128);
    if ((pointer)local_128._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._0_8_,local_118._0_8_ - local_128._0_8_);
    }
  }
  local_d0 = reporter;
  if ((config->m_data).listTags == true) {
    iVar4 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar6);
    pvVar7 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x20))
                       ((long *)CONCAT44(extraout_var_02,iVar5),config);
    filterTests(&local_78,pvVar7,(TestSpec *)CONCAT44(extraout_var_01,iVar4),&config->super_IConfig)
    ;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar8 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_d8 = config;
      do {
        pkVar1 = &((pTVar8->m_info->tags).
                   super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                   super__Vector_impl_data._M_finish)->original;
        local_80 = pTVar8;
        for (__k = &((pTVar8->m_info->tags).
                     super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                     super__Vector_impl_data._M_start)->original; __k != pkVar1; __k = __k + 1) {
          iVar9 = std::
                  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
                  ::find(&local_60,__k);
          if ((_Rb_tree_header *)iVar9._M_node == &local_60._M_impl.super__Rb_tree_header) {
            _Stack_c0._M_parent = (_Base_ptr)0x0;
            local_c8 = (undefined1  [8])0x0;
            _Stack_c0._0_8_ = (pointer)0x0;
            _Stack_c0._M_left = &_Stack_c0;
            local_a0 = 0;
            uStack_98 = 0;
            local_128._0_8_ = __k->m_start;
            local_128._8_8_ = __k->m_size;
            local_108._0_8_ = (_Rb_tree_node_base *)0x0;
            local_118._8_4_ = _S_red;
            local_f8._M_parent = (_Base_ptr)0x0;
            local_f8._M_left = (_Base_ptr)0x0;
            local_108._8_8_ = (_Base_ptr)(local_118 + 8);
            local_f8._0_8_ = (_Base_ptr)(local_118 + 8);
            _Stack_c0._M_right = _Stack_c0._M_left;
            pVar13 = std::
                     _Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                     ::_M_emplace_unique<std::pair<Catch::StringRef,Catch::TagInfo>>
                               ((_Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                                 *)&local_60,(pair<Catch::StringRef,_Catch::TagInfo> *)local_128);
            iVar9._M_node = (_Base_ptr)pVar13.first._M_node;
            std::
            _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
            ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                         *)local_118);
            std::
            _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
            ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                         *)local_c8);
          }
          local_128._0_8_ = __k->m_start;
          local_128._8_8_ = __k->m_size;
          *(long *)(iVar9._M_node + 3) = *(long *)(iVar9._M_node + 3) + 1;
          std::
          _Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
          ::_M_insert_unique<Catch::StringRef_const&>
                    ((_Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
                      *)&iVar9._M_node[1]._M_left,(StringRef *)local_128);
        }
        pTVar8 = local_80 + 1;
        config = local_d8;
        reporter = local_d0;
      } while (pTVar8 != local_88);
    }
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_118._0_8_ = (pointer)0x0;
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::reserve
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_128,
               local_60._M_impl.super__Rb_tree_header._M_node_count);
    p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::emplace_back<Catch::TagInfo>
                  ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_128,
                   (TagInfo *)&p_Var10[1]._M_left);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header);
    }
    (*reporter->_vptr_IEventListener[0x17])(reporter,local_128);
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::~vector
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_128);
    std::
    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
    ::~_Rb_tree(&local_60);
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    cVar11 = '\x01';
  }
  if ((config->m_data).listReporters == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar4 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar6);
    lVar2 = *(long *)CONCAT44(extraout_var_03,iVar4);
    if (lVar2 == 0) goto LAB_0014c161;
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::reserve
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8,*(size_type *)(lVar2 + 0x40));
    p_Var10 = *(_Rb_tree_node_base **)(lVar2 + 0x30);
    local_d8 = config;
    if (p_Var10 != (_Rb_tree_node_base *)(lVar2 + 0x20)) {
      do {
        local_128._0_8_ = (pointer)local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_128,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        SVar14.m_size = local_128._8_8_;
        SVar14.m_start = (char *)local_128._0_8_;
        if (*(long **)(p_Var10 + 2) == (long *)0x0) {
          __function = 
          "const T *Catch::Detail::unique_ptr<Catch::IReporterFactory>::operator->() const [T = Catch::IReporterFactory]"
          ;
          goto LAB_0014c157;
        }
        (**(code **)(**(long **)(p_Var10 + 2) + 0x18))(local_108);
        std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
        emplace_back<Catch::ReporterDescription>
                  ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                    *)local_c8,(ReporterDescription *)local_128);
        if ((_Rb_tree_node_base *)local_108._0_8_ != &local_f8) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
        }
        if ((pointer)local_128._0_8_ != (pointer)local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)(lVar2 + 0x20));
    }
    (*local_d0->_vptr_IEventListener[0x14])(local_d0,local_c8);
    config = local_d8;
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::~vector
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8);
    cVar11 = '\x01';
  }
  if ((config->m_data).listListeners == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar4 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar6);
    plVar3 = *(long **)CONCAT44(extraout_var_04,iVar4);
    if (plVar3 == (long *)0x0) {
LAB_0014c161:
      SVar14.m_size = local_128._8_8_;
      SVar14.m_start = (char *)local_128._0_8_;
      __function = 
      "const T *Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->() const [T = Catch::ReporterRegistry::ReporterRegistryImpl]"
      ;
LAB_0014c157:
      local_128 = (undefined1  [16])SVar14;
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x389,__function);
    }
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::reserve
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_c8,plVar3[1] - *plVar3 >> 3);
    plVar12 = (long *)*plVar3;
    plVar3 = (long *)plVar3[1];
    if (plVar12 != plVar3) {
      SVar14 = (StringRef)local_128;
      do {
        if ((long *)*plVar12 == (long *)0x0) {
LAB_0014c12b:
          __function = 
          "const T *Catch::Detail::unique_ptr<Catch::EventListenerFactory>::operator->() const [T = Catch::EventListenerFactory]"
          ;
          goto LAB_0014c157;
        }
        local_128 = (undefined1  [16])SVar14;
        SVar14 = (StringRef)(**(code **)(*(long *)*plVar12 + 0x18))();
        if ((long *)*plVar12 == (long *)0x0) goto LAB_0014c12b;
        local_128 = (undefined1  [16])SVar14;
        (**(code **)(*(long *)*plVar12 + 0x20))(local_118);
        std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
        emplace_back<Catch::ListenerDescription>
                  ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                    *)local_c8,(ListenerDescription *)local_128);
        if ((pointer)local_118._0_8_ != (pointer)local_108) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
        }
        plVar12 = plVar12 + 1;
        SVar14 = (StringRef)local_128;
      } while (plVar12 != plVar3);
    }
    (*local_d0->_vptr_IEventListener[0x15])(local_d0,local_c8);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::~vector
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_c8);
    cVar11 = '\x01';
  }
  return (bool)cVar11;
}

Assistant:

bool list( IEventListener& reporter, Config const& config ) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter);
        }
        if ( config.listListeners() ) {
            listed = true;
            listListeners( reporter );
        }
        return listed;
    }